

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O1

void __thiscall
AnyDistributionEdgeCalculator::AnyDistributionEdgeCalculator
          (AnyDistributionEdgeCalculator *this,double significance_level,
          HistogramBasedDistribution *ild)

{
  pointer pdVar1;
  pointer pdVar2;
  undefined1 auVar3 [8];
  vector<double,_std::allocator<double>_> *pvVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  insert_size_sum_dist;
  undefined1 local_20 [8];
  vector<double,_std::allocator<double>_> *local_18;
  
  (this->super_EdgeCalculator)._vptr_EdgeCalculator =
       (_func_int **)&PTR__AnyDistributionEdgeCalculator_001b9058;
  this->significance_level = significance_level;
  HistogramBasedDistribution::toDistribution
            ((HistogramBasedDistribution *)local_20,0.0001,(int *)ild);
  auVar3 = local_20;
  local_20 = (undefined1  [8])0x0;
  this->insert_size_dist = (vector<double,_std::allocator<double>_> *)auVar3;
  pdVar1 = (((_Vector_base<double,_std::allocator<double>_> *)auVar3)->_M_impl).
           super__Vector_impl_data._M_start;
  pdVar2 = (((_Vector_base<double,_std::allocator<double>_> *)auVar3)->_M_impl).
           super__Vector_impl_data._M_finish;
  lVar6 = (long)pdVar2 - (long)pdVar1 >> 3;
  if (pdVar2 == pdVar1) {
    dVar8 = 0.0;
  }
  else {
    dVar8 = 0.0;
    lVar7 = 0;
    do {
      dVar8 = dVar8 + pdVar1[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  if (pdVar2 != pdVar1) {
    lVar7 = 0;
    do {
      pdVar1[lVar7] = pdVar1[lVar7] / dVar8;
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  iVar5 = computeAllowableInsertSizeDiff(this);
  this->allowable_insert_size_diff = iVar5;
  Distributions::convolve
            ((Distributions *)local_20,this->insert_size_dist,this->insert_size_dist,
             this->insert_size_dist_offset,this->insert_size_dist_offset,
             &this->insert_size_sum_ccdf_offset);
  Distributions::toCCDF
            ((Distributions *)&local_18,(vector<double,_std::allocator<double>_> *)local_20);
  pvVar4 = local_18;
  auVar3 = local_20;
  local_18 = (vector<double,_std::allocator<double>_> *)0x0;
  this->insert_size_sum_ccdf = pvVar4;
  if (local_20 != (undefined1  [8])0x0) {
    pdVar1 = (((_Vector_base<double,_std::allocator<double>_> *)local_20)->_M_impl).
             super__Vector_impl_data._M_start;
    if (pdVar1 != (pointer)0x0) {
      operator_delete(pdVar1);
    }
    operator_delete((void *)auVar3);
  }
  return;
}

Assistant:

AnyDistributionEdgeCalculator::AnyDistributionEdgeCalculator(double significance_level, const HistogramBasedDistribution& ild) : significance_level(significance_level) {
	this->insert_size_dist = ild.toDistribution(1e-4, &insert_size_dist_offset).release();
// 	cerr << "Using internal segment size distribution: " << endl;
// 	for (int i=0; i < (int)insert_size_dist->size(); ++i) {
// 		cerr << (i+insert_size_dist_offset) << " " << insert_size_dist->at(i) << endl;
// 	}
	// since we truncated the tails (a bit), we renormalize back to one
	double sum = 0.0;
	for (size_t i=0; i < insert_size_dist->size(); ++i) sum += insert_size_dist->at(i);
	for (size_t i=0; i < insert_size_dist->size(); ++i) insert_size_dist->at(i) /= sum;
	allowable_insert_size_diff = computeAllowableInsertSizeDiff();
	// cout << "allowable insert size difference: " << allowable_insert_size_diff << endl;
	unique_ptr<vector<double> > insert_size_sum_dist = Distributions::convolve(*insert_size_dist, *insert_size_dist, insert_size_dist_offset, insert_size_dist_offset, &insert_size_sum_ccdf_offset);
	this->insert_size_sum_ccdf = Distributions::toCCDF(*insert_size_sum_dist).release();
}